

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalBatchCopyToFile::Combine
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  pointer *ppIVar1;
  pthread_mutex_t *__mutex;
  GlobalSinkState *gstate_p;
  LocalSinkState *lstate;
  ClientContext *context_00;
  bool bVar2;
  int iVar3;
  idx_t current_min_batch_index;
  
  gstate_p = input->global_state;
  lstate = input->local_state;
  LOCK();
  ppIVar1 = &gstate_p[4].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppIVar1 = (pointer)(&(*ppIVar1)->mode + lstate[3].partition_info.batch_index.index);
  UNLOCK();
  AddLocalBatch(this,context->client,gstate_p,lstate);
  if ((gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] & 1U) ==
      0) {
    __mutex = (pthread_mutex_t *)
              &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    LOCK();
    gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] = '\x01';
    UNLOCK();
    pthread_mutex_unlock(__mutex);
  }
  current_min_batch_index = optional_idx::GetIndex(&(lstate->partition_info).min_batch_index);
  BatchMemoryManager::UpdateMinBatchIndex
            ((BatchMemoryManager *)(gstate_p + 1),current_min_batch_index);
  context_00 = context->client;
  do {
    bVar2 = ExecuteTask(this,context_00,gstate_p);
  } while (bVar2);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalBatchCopyToFile::Combine(ExecutionContext &context,
                                                       OperatorSinkCombineInput &input) const {
	auto &state = input.local_state.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;
	gstate.rows_copied += state.rows_copied;

	// add any final remaining local batches
	AddLocalBatch(context.client, gstate, state);

	if (!gstate.any_finished) {
		// signal that this thread is finished processing batches and that we should move on to Finalize
		lock_guard<mutex> l(gstate.lock);
		gstate.any_finished = true;
	}
	memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());
	ExecuteTasks(context.client, gstate);

	return SinkCombineResultType::FINISHED;
}